

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_LBackward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  complex<float> *pcVar1;
  long index;
  complex<float> *__z;
  complex<float> *pcVar2;
  int64_t iVar3;
  complex<float> **ppcVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  complex<float> *this_00;
  complex<float> val;
  complex<float> *BPtr;
  complex<float> *end_ki;
  complex<float> *elem_ki;
  int64_t j;
  int64_t k;
  int64_t Dimension;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  complex<float> *in_stack_ffffffffffffffb0;
  _func_int **in_stack_ffffffffffffffb8;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffc0;
  complex<float> *local_30;
  complex<float> *local_28;
  long local_20;
  
  __z = (complex<float> *)TPZBaseMatrix::Rows(in_RSI);
  pcVar2 = (complex<float> *)(**(code **)(*in_RDI + 0x60))();
  if (((__z != pcVar2) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] == '\x03')) {
    TPZMatrix<std::complex<float>_>::Error(in_stack_000001a0,in_stack_00000198);
  }
  local_20 = (**(code **)(*in_RDI + 0x60))();
  while (index = local_20, local_20 = index + -1, 0 < local_20) {
    local_28 = (complex<float> *)0x0;
    while (pcVar2 = local_28, iVar3 = TPZBaseMatrix::Cols(in_RSI), (long)pcVar2 < iVar3) {
      ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                          ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),local_20);
      local_30 = *ppcVar4;
      ppcVar4 = TPZVec<std::complex<float>_*>::operator[]
                          ((TPZVec<std::complex<float>_*> *)(in_RDI + 4),index);
      pcVar1 = *ppcVar4;
      in_stack_ffffffffffffffc0 =
           (TPZFMatrix<std::complex<float>_> *)
           TPZFMatrix<std::complex<float>_>::operator()
                     (in_stack_ffffffffffffffc0,(int64_t)in_stack_ffffffffffffffb8,
                      (int64_t)in_stack_ffffffffffffffb0);
      in_stack_ffffffffffffffb8 =
           (in_stack_ffffffffffffffc0->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
           super_TPZSavable._vptr_TPZSavable;
      while (local_30 = local_30 + 1, local_30 < pcVar1) {
        std::operator*(pcVar2,(complex<float> *)0x13702ec);
        in_stack_ffffffffffffffc0 =
             (TPZFMatrix<std::complex<float>_> *)&in_stack_ffffffffffffffc0[-1].fWork.fNAlloc;
        in_stack_ffffffffffffffb0 = this_00;
        std::complex<float>::operator-=(this_00,__z);
      }
      local_28 = (complex<float> *)((long)&local_28->_M_value + 1);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed || this->fDecomposed == ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_LBackward not decomposed properly");
    
    int64_t Dimension = this->Dim();
    for ( int64_t k = Dimension-1; k > 0; k-- ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            //		TVar val = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            // substract the column of the skyline matrix from the vector.
            
            TVar val = *BPtr;
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    return( 1 );
}